

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O0

void __thiscall
duckdb::BaseAppender::AppendValueInternal<signed_char,unsigned_short>
          (BaseAppender *this,Vector *col,char input)

{
  unsigned_short uVar1;
  unsigned_short *puVar2;
  idx_t iVar3;
  long in_RDI;
  char unaff_retaddr;
  
  uVar1 = Cast::Operation<signed_char,unsigned_short>(unaff_retaddr);
  puVar2 = FlatVector::GetData<unsigned_short>((Vector *)0x93b6c7);
  iVar3 = DataChunk::size((DataChunk *)(in_RDI + 0x48));
  puVar2[iVar3] = uVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}